

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O3

stsentry * Curl_hsts(hsts *h,char *hostname,_Bool subdomain)

{
  char *__s;
  int iVar1;
  time_t tVar2;
  size_t sVar3;
  Curl_llist_node *n;
  stsentry *e;
  long lVar4;
  char buffer [257];
  undefined8 local_140;
  char local_138 [264];
  
  if (h != (hsts *)0x0) {
    tVar2 = time((time_t *)0x0);
    sVar3 = strlen(hostname);
    if (0xff < sVar3 - 1) {
      return (stsentry *)0x0;
    }
    memcpy(local_138,hostname,sVar3);
    local_140 = sVar3 - 1;
    if (hostname[sVar3 - 1] != '.') {
      local_140 = sVar3;
    }
    local_138[local_140] = '\0';
    n = Curl_llist_head(&h->list);
    if (n != (Curl_llist_node *)0x0) {
      do {
        e = (stsentry *)Curl_node_elem(n);
        n = Curl_node_next(n);
        if (tVar2 < e->expires) {
          if ((subdomain) && (e->includeSubDomains == true)) {
            __s = e->host;
            sVar3 = strlen(__s);
            lVar4 = local_140 - sVar3;
            if ((sVar3 <= local_140 && lVar4 != 0) &&
               ((local_138[lVar4 + -1] == '.' &&
                (iVar1 = curl_strnequal(local_138 + lVar4,__s,sVar3), iVar1 != 0)))) {
              return e;
            }
          }
          iVar1 = curl_strequal(local_138,e->host);
          if (iVar1 != 0) {
            return e;
          }
        }
        else {
          Curl_node_remove((Curl_llist_node *)e);
          (*Curl_cfree)(e->host);
          (*Curl_cfree)(e);
        }
      } while (n != (Curl_llist_node *)0x0);
    }
  }
  return (stsentry *)0x0;
}

Assistant:

struct stsentry *Curl_hsts(struct hsts *h, const char *hostname,
                           bool subdomain)
{
  if(h) {
    char buffer[MAX_HSTS_HOSTLEN + 1];
    time_t now = time(NULL);
    size_t hlen = strlen(hostname);
    struct Curl_llist_node *e;
    struct Curl_llist_node *n;

    if((hlen > MAX_HSTS_HOSTLEN) || !hlen)
      return NULL;
    memcpy(buffer, hostname, hlen);
    if(hostname[hlen-1] == '.')
      /* remove the trailing dot */
      --hlen;
    buffer[hlen] = 0;
    hostname = buffer;

    for(e = Curl_llist_head(&h->list); e; e = n) {
      struct stsentry *sts = Curl_node_elem(e);
      n = Curl_node_next(e);
      if(sts->expires <= now) {
        /* remove expired entries */
        Curl_node_remove(&sts->node);
        hsts_free(sts);
        continue;
      }
      if(subdomain && sts->includeSubDomains) {
        size_t ntail = strlen(sts->host);
        if(ntail < hlen) {
          size_t offs = hlen - ntail;
          if((hostname[offs-1] == '.') &&
             strncasecompare(&hostname[offs], sts->host, ntail))
            return sts;
        }
      }
      if(strcasecompare(hostname, sts->host))
        return sts;
    }
  }
  return NULL; /* no match */
}